

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprModule * AnalyzeModule(ExpressionContext *ctx,SynModule *syntax)

{
  CompilerStatistics *this;
  Allocator *pAVar1;
  TypeBase *pTVar2;
  ScopeData *pSVar3;
  FunctionData *pFVar4;
  VariableData *pVVar5;
  InplaceStr name;
  ExprBase *pEVar6;
  uint uVar7;
  int iVar8;
  ByteCode *bytecode;
  Lexeme *lexStream;
  ExprBase *pEVar9;
  undefined4 extraout_var;
  IntrusiveList<ExprBase> *this_00;
  ExprBase **ppEVar11;
  FunctionData **ppFVar12;
  char *pcVar13;
  TypeBase **ppTVar14;
  SynBase *pSVar15;
  VariableData **ppVVar16;
  undefined4 extraout_var_00;
  _func_int **pp_Var17;
  uint i_5;
  SynModuleImport *syntax_00;
  uint i;
  IntrusiveList<SynBase> *pIVar18;
  FunctionData *function;
  ExprModule *local_2b8;
  SmallArray<VariableData_*,_128U> *local_2b0;
  TraceScope traceScope_3;
  TraceScope traceScope;
  IntrusiveList<ExprBase> expressions;
  uint lexStreamSize;
  undefined4 uStack_264;
  undefined8 uStack_260;
  FunctionData *local_258 [32];
  Allocator *local_158;
  SmallArray<TypeClass_*,_32U> classTypes;
  ExprModule *pEVar10;
  undefined4 extraout_var_01;
  
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar8 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar8 != 0) {
      AnalyzeModule::token = NULLC::TraceGetToken("analyze","AnalyzeModule");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&traceScope,AnalyzeModule::token);
  uVar7 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar7;
  (ctx->statistics).finishTime = 0;
  bytecode = (ByteCode *)BinaryCache::GetBytecode("$base$.nc");
  if (bytecode != (ByteCode *)0x0) {
    _lexStreamSize = (ExprBase *)((ulong)_lexStreamSize & 0xffffffff00000000);
    lexStream = BinaryCache::GetLexems("$base$.nc",&lexStreamSize);
    name.end = "";
    name.begin = "$base$.nc";
    ImportModule(ctx,&syntax->super_SynBase,bytecode,lexStream,lexStreamSize,name);
    ctx->baseModuleFunctionCount = (ctx->functions).count;
  }
  this = &ctx->statistics;
  syntax_00 = (syntax->imports).head;
  while (syntax_00 != (SynModuleImport *)0x0) {
    AnalyzeModuleImport(ctx,syntax_00);
    syntax_00 = (SynModuleImport *)(syntax_00->super_SynBase).next;
    if ((syntax_00 == (SynModuleImport *)0x0) || ((syntax_00->super_SynBase).typeID != 0x42)) {
      syntax_00 = (SynModuleImport *)0x0;
    }
  }
  AnalyzeImplicitModuleImports(ctx);
  uVar7 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(this,"Import",uVar7);
  uVar7 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar7;
  (ctx->statistics).finishTime = 0;
  expressions.head = (ExprBase *)0x0;
  expressions.tail = (ExprBase *)0x0;
  pIVar18 = &syntax->expressions;
  while (pSVar15 = pIVar18->head, pSVar15 != (SynBase *)0x0) {
    pEVar9 = AnalyzeStatement(ctx,pSVar15);
    IntrusiveList<ExprBase>::push_back(&expressions,pEVar9);
    pIVar18 = (IntrusiveList<SynBase> *)&pSVar15->next;
  }
  uVar7 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(this,"Expressions",uVar7);
  uVar7 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar7;
  (ctx->statistics).finishTime = 0;
  ClosePendingUpvalues(ctx,(FunctionData *)0x0);
  if (ctx->errorCount == 0) {
    CreateDefaultArgumentFunctionWrappers(ctx);
  }
  iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
  pEVar10 = (ExprModule *)CONCAT44(extraout_var,iVar8);
  pAVar1 = ctx->allocator;
  pTVar2 = ctx->typeVoid;
  pSVar3 = ctx->globalScope;
  _lexStreamSize = expressions.head;
  pEVar9 = _lexStreamSize;
  uStack_260 = expressions.tail;
  pEVar6 = uStack_260;
  (pEVar10->super_ExprBase).typeID = 0x38;
  (pEVar10->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar10->super_ExprBase).type = pTVar2;
  (pEVar10->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar10->super_ExprBase).listed = false;
  (pEVar10->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprModule_003e4208;
  pEVar10->moduleScope = pSVar3;
  (pEVar10->definitions).allocator = pAVar1;
  (pEVar10->definitions).data = (pEVar10->definitions).little;
  (pEVar10->definitions).count = 0;
  (pEVar10->definitions).max = 0x20;
  (pEVar10->setup).head = (ExprBase *)0x0;
  (pEVar10->setup).tail = (ExprBase *)0x0;
  lexStreamSize = (uint)expressions.head;
  uStack_264 = (undefined4)((ulong)expressions.head >> 0x20);
  uStack_260._0_4_ = (uint)expressions.tail;
  uStack_260._4_4_ = (uint)((ulong)expressions.tail >> 0x20);
  *(uint *)&(pEVar10->expressions).head = lexStreamSize;
  *(undefined4 *)((long)&(pEVar10->expressions).head + 4) = uStack_264;
  *(uint *)&(pEVar10->expressions).tail = (uint)uStack_260;
  *(uint *)((long)&(pEVar10->expressions).tail + 4) = uStack_260._4_4_;
  _lexStreamSize = pEVar9;
  uStack_260 = pEVar6;
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar8 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar8 != 0) {
      AnalyzeModule(ExpressionContext&,SynModule*)::token =
           NULLC::TraceGetToken("analyze","definitions");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)&lexStreamSize,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  this_00 = &pEVar10->setup;
  local_2b8 = pEVar10;
  for (uVar7 = 0; uVar7 < (ctx->definitions).count; uVar7 = uVar7 + 1) {
    ppEVar11 = SmallArray<ExprBase_*,_128U>::operator[](&ctx->definitions,uVar7);
    SmallArray<ExprBase_*,_32U>::push_back(&pEVar10->definitions,ppEVar11);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)&lexStreamSize);
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar8 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar8 != 0) {
      AnalyzeModule(ExpressionContext&,SynModule*)::token = NULLC::TraceGetToken("analyze","setup");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)&lexStreamSize,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  for (uVar7 = 0; uVar7 < (ctx->setup).count; uVar7 = uVar7 + 1) {
    ppEVar11 = SmallArray<ExprBase_*,_128U>::operator[](&ctx->setup,uVar7);
    IntrusiveList<ExprBase>::push_back(this_00,*ppEVar11);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)&lexStreamSize);
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar8 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar8 != 0) {
      AnalyzeModule(ExpressionContext&,SynModule*)::token =
           NULLC::TraceGetToken("analyze","vtables");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&traceScope_3,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  local_158 = ctx->allocator;
  _lexStreamSize = (ExprBase *)local_258;
  uStack_260._0_4_ = 0;
  uStack_260._4_4_ = 0x20;
  classTypes.data = classTypes.little;
  classTypes.count = 0;
  classTypes.max = 0x20;
  classTypes.allocator = local_158;
  for (uVar7 = 0; uVar7 < (ctx->functions).count; uVar7 = uVar7 + 1) {
    ppFVar12 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->functions,uVar7);
    function = *ppFVar12;
    pTVar2 = function->scope->ownerType;
    if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->isGeneric == false)) {
      pcVar13 = strstr((function->name->name).begin,"::");
      if (pcVar13 != (char *)0x0) {
        SmallArray<FunctionData_*,_32U>::push_back
                  ((SmallArray<FunctionData_*,_32U> *)&lexStreamSize,&function);
      }
    }
  }
  for (uVar7 = 0; uVar7 < (ctx->types).count; uVar7 = uVar7 + 1) {
    ppTVar14 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->types,uVar7);
    pFVar4 = (FunctionData *)*ppTVar14;
    if ((pFVar4 != (FunctionData *)0x0) && (*(uint *)&pFVar4->importModule == 0x18)) {
      function = pFVar4;
      SmallArray<TypeClass_*,_32U>::push_back(&classTypes,(TypeClass **)&function);
    }
  }
  for (uVar7 = 0; uVar7 < (ctx->vtables).count; uVar7 = uVar7 + 1) {
    pSVar15 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    ppVVar16 = SmallArray<VariableData_*,_128U>::operator[](&ctx->vtables,uVar7);
    pEVar9 = CreateVirtualTableUpdate
                       (ctx,pSVar15,*ppVVar16,(SmallArray<FunctionData_*,_32U> *)&lexStreamSize,
                        &classTypes);
    IntrusiveList<ExprBase>::push_back(this_00,pEVar9);
  }
  SmallArray<TypeClass_*,_32U>::~SmallArray(&classTypes);
  SmallArray<FunctionData_*,_32U>::~SmallArray((SmallArray<FunctionData_*,_32U> *)&lexStreamSize);
  NULLC::TraceScope::~TraceScope(&traceScope_3);
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar8 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar8 != 0) {
      AnalyzeModule(ExpressionContext&,SynModule*)::token =
           NULLC::TraceGetToken("analyze","upvalues");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)&lexStreamSize,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  local_2b0 = &ctx->upvalues;
  for (uVar7 = 0; uVar7 < (ctx->upvalues).count; uVar7 = uVar7 + 1) {
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar9 = (ExprBase *)CONCAT44(extraout_var_00,iVar8);
    pSVar15 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    pTVar2 = ctx->typeVoid;
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pp_Var17 = (_func_int **)CONCAT44(extraout_var_01,iVar8);
    ppVVar16 = SmallArray<VariableData_*,_128U>::operator[](local_2b0,uVar7);
    pVVar5 = *ppVVar16;
    *pp_Var17 = (_func_int *)0x0;
    pp_Var17[1] = (_func_int *)pVVar5;
    pp_Var17[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var17 + 3) = 0;
    pEVar9->typeID = 0x1e;
    pEVar9->source = pSVar15;
    pEVar9->type = pTVar2;
    pEVar9->next = (ExprBase *)0x0;
    pEVar9->listed = false;
    pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e34e8;
    pEVar9[1]._vptr_ExprBase = pp_Var17;
    *(undefined8 *)&pEVar9[1].typeID = 0;
    IntrusiveList<ExprBase>::push_back(this_00,pEVar9);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)&lexStreamSize);
  uVar7 = NULLCTime::clockMicro();
  pEVar10 = local_2b8;
  CompilerStatistics::Finish(this,"Finalization",uVar7);
  NULLC::TraceScope::~TraceScope(&traceScope);
  return pEVar10;
}

Assistant:

ExprModule* AnalyzeModule(ExpressionContext &ctx, SynModule *syntax)
{
	TRACE_SCOPE("analyze", "AnalyzeModule");

	ctx.statistics.Start(NULLCTime::clockMicro());

	// Import base module
	if(const char *bytecode = BinaryCache::GetBytecode("$base$.nc"))
	{
		unsigned lexStreamSize = 0;
		Lexeme *lexStream = BinaryCache::GetLexems("$base$.nc", lexStreamSize);

		if(bytecode)
			ImportModule(ctx, syntax, (ByteCode*)bytecode, lexStream, lexStreamSize, InplaceStr("$base$.nc"));
		else
			Stop(ctx, syntax, "ERROR: base module couldn't be imported");

		ctx.baseModuleFunctionCount = ctx.functions.size();
	}

	for(SynModuleImport *import = syntax->imports.head; import; import = getType<SynModuleImport>(import->next))
		AnalyzeModuleImport(ctx, import);

	AnalyzeImplicitModuleImports(ctx);

	ctx.statistics.Finish("Import", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expr = syntax->expressions.head; expr; expr = expr->next)
		expressions.push_back(AnalyzeStatement(ctx, expr));

	ctx.statistics.Finish("Expressions", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	ClosePendingUpvalues(ctx, NULL);

	// Don't create wrappers in ill-formed module
	if(ctx.errorCount == 0)
		CreateDefaultArgumentFunctionWrappers(ctx);

	ExprModule *module = new (ctx.get<ExprModule>()) ExprModule(ctx.allocator, syntax, ctx.typeVoid, ctx.globalScope, expressions);

	{
		TRACE_SCOPE("analyze", "definitions");

		for(unsigned i = 0; i < ctx.definitions.size(); i++)
			module->definitions.push_back(ctx.definitions[i]);
	}

	{
		TRACE_SCOPE("analyze", "setup");

		for(unsigned i = 0; i < ctx.setup.size(); i++)
			module->setup.push_back(ctx.setup[i]);
	}

	{
		TRACE_SCOPE("analyze", "vtables");

		SmallArray<FunctionData*, 32> possibleFunctions(ctx.allocator);
		SmallArray<TypeClass*, 32> classTypes(ctx.allocator);

		for(unsigned i = 0; i < ctx.functions.size(); i++)
		{
			FunctionData *function = ctx.functions[i];

			TypeBase *parentType = function->scope->ownerType;

			if(!parentType)
				continue;

			if(parentType->isGeneric)
				continue;

			const char *pos = strstr(function->name->name.begin, "::");

			if(!pos)
				continue;

			possibleFunctions.push_back(function);
		}

		for(unsigned i = 0; i < ctx.types.size(); i++)
		{
			TypeBase *type = ctx.types[i];

			if(TypeClass *classType = getType<TypeClass>(type))
				classTypes.push_back(classType);
		}

		for(unsigned i = 0; i < ctx.vtables.size(); i++)
			module->setup.push_back(CreateVirtualTableUpdate(ctx, ctx.MakeInternal(syntax), ctx.vtables[i], possibleFunctions, classTypes));
	}

	{
		TRACE_SCOPE("analyze", "upvalues");

		for(unsigned i = 0; i < ctx.upvalues.size(); i++)
			module->setup.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(ctx.MakeInternal(syntax), ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, ctx.upvalues[i]), NULL));
	}

	ctx.statistics.Finish("Finalization", NULLCTime::clockMicro());

	return module;
}